

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::SmallButton(char *label)

{
  float fVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImVec2 local_10;
  
  pIVar2 = GImGui;
  fVar1 = (GImGui->Style).FramePadding.y;
  (GImGui->Style).FramePadding.y = 0.0;
  local_10.x = 0.0;
  local_10.y = 0.0;
  bVar3 = ButtonEx(label,&local_10,0x200);
  (pIVar2->Style).FramePadding.y = fVar1;
  return bVar3;
}

Assistant:

bool ImGui::SmallButton(const char* label)
{
    ImGuiContext& g = *GImGui;
    float backup_padding_y = g.Style.FramePadding.y;
    g.Style.FramePadding.y = 0.0f;
    bool pressed = ButtonEx(label, ImVec2(0, 0), ImGuiButtonFlags_AlignTextBaseLine);
    g.Style.FramePadding.y = backup_padding_y;
    return pressed;
}